

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::FormatCxxExceptionMessage_abi_cxx11_(char *description,char *location)

{
  Message *pMVar1;
  long in_RSI;
  string *in_RDI;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  char *local_28;
  char *local_20;
  
  Message::Message((Message *)&local_30);
  if (in_RSI == 0) {
    std::operator<<((ostream *)(local_30._M_head_impl + 0x10),"Unknown C++ exception");
  }
  else {
    std::operator<<((ostream *)(local_30._M_head_impl + 0x10),"C++ exception with description \"");
    pMVar1 = Message::operator<<((Message *)&local_30,&local_20);
    Message::operator<<(pMVar1,(char (*) [2])0x14347f);
  }
  std::operator<<((ostream *)(local_30._M_head_impl + 0x10)," thrown in ");
  pMVar1 = Message::operator<<((Message *)&local_30,&local_28);
  Message::operator<<(pMVar1,(char (*) [2])0x14342e);
  StringStreamToString(in_RDI,local_30._M_head_impl);
  if (local_30._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_30._M_head_impl + 8))();
  }
  return in_RDI;
}

Assistant:

static std::string FormatCxxExceptionMessage(const char* description,
                                             const char* location) {
  Message message;
  if (description != nullptr) {
    message << "C++ exception with description \"" << description << "\"";
  } else {
    message << "Unknown C++ exception";
  }
  message << " thrown in " << location << ".";

  return message.GetString();
}